

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsPostsolveStatus __thiscall Highs::runPostsolve(Highs *this)

{
  byte bVar1;
  PresolveComponent *in_RDI;
  HighsPostsolveStatus postsolve_status;
  bool have_dual_solution;
  bool have_primal_solution;
  HighsInt in_stack_00000174;
  HighsBasis *in_stack_00000178;
  HighsSolution *in_stack_00000180;
  HighsOptions *in_stack_00000188;
  HighsPostsolveStack *in_stack_00000190;
  HighsSolution *in_stack_ffffffffffffffd8;
  PresolveComponent *this_00;
  HighsPostsolveStatus local_4;
  
  if (((ulong)in_RDI[0xe].data_.reduced_lp_.row_upper_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish & 1) == 0) {
    local_4 = kNoPrimalSolutionError;
  }
  else {
    bVar1 = *(byte *)((long)&in_RDI[0xe].data_.reduced_lp_.row_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1);
    this_00 = in_RDI;
    ::presolve::HighsPostsolveStack::undo
              (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178,
               in_stack_00000174);
    calculateRowValuesQuad((HighsLp *)in_RDI,in_stack_ffffffffffffffd8,0);
    if (((bVar1 & 1) != 0) &&
       ((int)(in_RDI->data_).reduced_lp_.row_hash_.name2index._M_h._M_element_count == -1)) {
      PresolveComponent::negateReducedLpColDuals(this_00);
    }
    *(undefined4 *)
     ((long)&in_RDI[0xe].data_.reduced_lp_.row_names_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 1;
    local_4 = kSolutionRecovered;
  }
  return local_4;
}

Assistant:

HighsPostsolveStatus Highs::runPostsolve() {
  // assert(presolve_.has_run_);
  const bool have_primal_solution =
      presolve_.data_.recovered_solution_.value_valid;
  // Need at least a primal solution
  if (!have_primal_solution)
    return HighsPostsolveStatus::kNoPrimalSolutionError;
  const bool have_dual_solution =
      presolve_.data_.recovered_solution_.dual_valid;
  presolve_.data_.postSolveStack.undo(options_,
                                      presolve_.data_.recovered_solution_,
                                      presolve_.data_.recovered_basis_);
  // Compute the row activities
  assert(model_.lp_.a_matrix_.isColwise());
  calculateRowValuesQuad(model_.lp_, presolve_.data_.recovered_solution_);

  if (have_dual_solution && model_.lp_.sense_ == ObjSense::kMaximize)
    presolve_.negateReducedLpColDuals();

  // Ensure that the postsolve status is used to set
  // presolve_.postsolve_status_, as well as being returned
  HighsPostsolveStatus postsolve_status =
      HighsPostsolveStatus::kSolutionRecovered;
  presolve_.postsolve_status_ = postsolve_status;
  return postsolve_status;
}